

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::setText(RuleBasedBreakIterator *this,UText *ut,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString local_60;
  UErrorCode *local_20;
  UErrorCode *status_local;
  UText *ut_local;
  RuleBasedBreakIterator *this_local;
  
  local_20 = status;
  status_local = (UErrorCode *)ut;
  ut_local = (UText *)this;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    BreakCache::reset(this->fBreakCache,0,0);
    DictionaryCache::reset(this->fDictionaryCache);
    utext_clone_63(&this->fText,(UText *)status_local,'\0','\x01',local_20);
    icu_63::UnicodeString::UnicodeString(&local_60);
    StringCharacterIterator::setText(&this->fSCharIter,&local_60);
    icu_63::UnicodeString::~UnicodeString(&local_60);
    if (((StringCharacterIterator *)this->fCharIter != &this->fSCharIter) &&
       (this->fCharIter != (CharacterIterator *)0x0)) {
      (*(this->fCharIter->super_ForwardCharacterIterator).super_UObject._vptr_UObject[1])();
    }
    this->fCharIter = (CharacterIterator *)&this->fSCharIter;
    (*(this->super_BreakIterator).super_UObject._vptr_UObject[10])();
  }
  return;
}

Assistant:

void RuleBasedBreakIterator::setText(UText *ut, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return;
    }
    fBreakCache->reset();
    fDictionaryCache->reset();
    utext_clone(&fText, ut, FALSE, TRUE, &status);

    // Set up a dummy CharacterIterator to be returned if anyone
    //   calls getText().  With input from UText, there is no reasonable
    //   way to return a characterIterator over the actual input text.
    //   Return one over an empty string instead - this is the closest
    //   we can come to signaling a failure.
    //   (GetText() is obsolete, this failure is sort of OK)
    fSCharIter.setText(UnicodeString());

    if (fCharIter != &fSCharIter) {
        // existing fCharIter was adopted from the outside.  Delete it now.
        delete fCharIter;
    }
    fCharIter = &fSCharIter;

    this->first();
}